

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

string * demangle_abi_cxx11_(string *__return_storage_ptr__,char *mangled_name)

{
  unique_ptr<char,_void_(*)(void_*)> ptr;
  int status;
  size_t len;
  allocator local_29;
  unique_ptr<char,_void_(*)(void_*)> local_28;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0;
  local_14 = 0;
  local_28._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = (char *)__cxa_demangle(mangled_name,0);
  local_28._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             local_28._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
             _M_head_impl,&local_29);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char* mangled_name) {
  std::size_t len = 0;
  int status = 0;
  std::unique_ptr<char, decltype(&std::free)> ptr(
      __cxxabiv1::__cxa_demangle(mangled_name, nullptr, &len, &status),
      &std::free);
  return ptr.get();
}